

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_line_to(FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  FT_Memory memory;
  FT_Error error;
  SDF_Contour *contour;
  SDF_Edge *edge;
  SDF_Shape *shape;
  void *user_local;
  FT_26D6_Vec *to_local;
  
  contour = (SDF_Contour *)0x0;
  memory._4_4_ = 0;
  if ((to == (FT_26D6_Vec *)0x0) || (user == (void *)0x0)) {
    memory._4_4_ = 6;
  }
  else {
    plVar1 = *(long **)((long)user + 8);
    if (((*plVar1 != to->x) || (plVar1[1] != to->y)) &&
       (edge = (SDF_Edge *)user, shape = (SDF_Shape *)user, user_local = to,
       memory._4_4_ = sdf_edge_new(*user,(SDF_Edge **)&contour), memory._4_4_ == 0)) {
      *(undefined4 *)&contour[2].last_pos.x = 1;
      (contour->last_pos).x = *plVar1;
      (contour->last_pos).y = plVar1[1];
      contour->edges = *user_local;
      contour->next = *(SDF_Contour_ **)((long)user_local + 8);
      contour[2].last_pos.y = plVar1[2];
      plVar1[2] = (long)contour;
      *plVar1 = *user_local;
      plVar1[1] = *(long *)((long)user_local + 8);
    }
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  sdf_line_to( const FT_26D6_Vec*  to,
               void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error      error    = FT_Err_Ok;
    FT_Memory     memory   = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    if ( contour->last_pos.x == to->x &&
         contour->last_pos.y == to->y )
      goto Exit;

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_LINE;
    edge->start_pos = contour->last_pos;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }